

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeVLDST3Instruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint16_t *puVar6;
  uint64_t extraout_RDX;
  uint64_t uVar7;
  uint64_t extraout_RDX_00;
  uint64_t extraout_RDX_01;
  uint uVar8;
  
  bVar4 = (byte)((Insn & 0x20) >> 5) | (~Insn & 0xc0) == 0;
  if (bVar4 != 0) {
    return MCDisassembler_Fail;
  }
  if ((Insn >> 0x15 & 1) == 0) {
    DVar1 = DecodeVSTInstruction(Inst,Insn,Address,(void *)(ulong)bVar4);
    return DVar1;
  }
  uVar8 = Insn >> 0x12 & 0x10 | Insn >> 0xc & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  if (uVar2 - 0x391 < 0xc) {
LAB_0015229b:
    if (uVar8 == 0x1f) {
      return MCDisassembler_Fail;
    }
    puVar6 = DPairDecoderTable;
  }
  else if (uVar2 - 0x3d2 < 9) {
    if (0x1d < uVar8) {
      return MCDisassembler_Fail;
    }
    puVar6 = DPairSpacedDecoderTable;
  }
  else {
    if (uVar2 - 0x3db < 9) goto LAB_0015229b;
    puVar6 = DPRDecoderTable;
  }
  MCOperand_CreateReg0(Inst,(uint)puVar6[uVar8]);
  uVar3 = MCInst_getOpcode(Inst);
  iVar5 = 1;
  uVar2 = uVar3 - 0x43d;
  if (uVar2 < 0x22) {
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_00152307;
LAB_0015232c:
      iVar5 = 2;
    }
LAB_00152331:
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[iVar5 + uVar8 & 0x1f]);
  }
  else {
LAB_00152307:
    uVar3 = uVar3 - 0x4b1;
    if (uVar3 < 0x22) {
      if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00152331;
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_0015232c;
    }
  }
  uVar3 = MCInst_getOpcode(Inst);
  puVar6 = (uint16_t *)0x2;
  uVar2 = uVar3 - 0x43d;
  if (uVar2 < 0x22) {
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_00152384;
LAB_001523a9:
      puVar6 = (uint16_t *)0x4;
    }
LAB_001523ae:
    puVar6 = (uint16_t *)(ulong)((int)puVar6 + uVar8 & 0x1f);
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[(long)puVar6]);
  }
  else {
LAB_00152384:
    uVar3 = uVar3 - 0x4b1;
    if (uVar3 < 0x22) {
      if ((0x999UL >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_001523ae;
      puVar6 = (uint16_t *)0x294a00000;
      if ((0x294a00000U >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_001523a9;
    }
  }
  uVar3 = Insn >> 0x10 & 0xf;
  uVar2 = MCInst_getOpcode(Inst);
  uVar2 = uVar2 - 0x4b1;
  if (uVar2 < 0x22) {
    puVar6 = (uint16_t *)0x3;
    if ((0x999UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
      puVar6 = (uint16_t *)0x294a00000;
      if ((0x294a00000U >> ((ulong)uVar2 & 0x3f) & 1) == 0) goto LAB_00152424;
      puVar6 = (uint16_t *)0x6;
    }
    MCOperand_CreateReg0(Inst,(uint)DPRDecoderTable[uVar8 + (int)puVar6 & 0x1f]);
  }
LAB_00152424:
  uVar2 = MCInst_getOpcode(Inst);
  uVar7 = extraout_RDX;
  if ((int)uVar2 < 0x3d3) {
    if ((uVar2 - 0x369 < 0x34) &&
       (puVar6 = (uint16_t *)0xdb6f67860f67b,
       (0xdb6f67860f67bU >> ((ulong)(uVar2 - 0x369) & 0x3f) & 1) != 0)) {
LAB_00152471:
      MCOperand_CreateImm0(Inst,0);
      uVar7 = extraout_RDX_00;
    }
  }
  else {
    puVar6 = (uint16_t *)(ulong)(uVar2 - 0x3d3);
    if ((uVar2 - 0x3d3 < 0x23) &&
       (uVar7 = 0x61861b6db, (0x61861b6dbU >> ((ulong)puVar6 & 0x3f) & 1) != 0)) goto LAB_00152471;
    uVar8 = uVar2 - 0x440;
    puVar6 = (uint16_t *)(ulong)uVar8;
    if (((uVar8 < 0x1f) && (uVar7 = 0x42100111, (0x42100111U >> (uVar8 & 0x1f) & 1) != 0)) ||
       ((uVar2 - 0x4b4 < 0x1f &&
        (puVar6 = (uint16_t *)0x42100111, (0x42100111U >> (uVar2 - 0x4b4 & 0x1f) & 1) != 0)))) {
      puVar6 = GPRDecoderTable;
      MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar3]);
      uVar7 = extraout_RDX_01;
    }
  }
  DVar1 = DecodeAddrMode6Operand(Inst,Insn & 0x30 | uVar3,uVar7,puVar6);
  if ((DVar1 | 2) != MCDisassembler_Success) {
    return MCDisassembler_Fail;
  }
  uVar2 = MCInst_getOpcode(Inst);
  if ((0x33 < uVar2 - 0x369) || ((0xdb6d26820d269U >> ((ulong)(uVar2 - 0x369) & 0x3f) & 1) == 0)) {
    if ((uVar2 - 0x3d3 < 0x22) && ((0x208209249U >> ((ulong)(uVar2 - 0x3d3) & 0x3f) & 1) != 0)) {
      return DVar1;
    }
    uVar2 = 0;
    if ((Insn & 0xf) == 0xd) goto LAB_001524d1;
  }
  if ((~Insn & 0xd) == 0) {
    return DVar1;
  }
  uVar2 = (uint)GPRDecoderTable[Insn & 0xf];
LAB_001524d1:
  MCOperand_CreateReg0(Inst,uVar2);
  return DVar1;
}

Assistant:

static DecodeStatus DecodeVLDST3Instruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned align, load;
	unsigned size = fieldFromInstruction_4(Insn, 6, 2);
	if (size == 3) return MCDisassembler_Fail;

	align = fieldFromInstruction_4(Insn, 4, 2);
	if (align & 2) return MCDisassembler_Fail;

	load = fieldFromInstruction_4(Insn, 21, 1);
	return load ? DecodeVLDInstruction(Inst, Insn, Address, Decoder)
		: DecodeVSTInstruction(Inst, Insn, Address, Decoder);
}